

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

void __thiscall Fl_Table::rows(Fl_Table *this,int val)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *piVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  iVar1 = this->_rows;
  this->_rows = val;
  uVar2 = (this->_rowheights)._size;
  lVar9 = (long)(int)uVar2;
  if (lVar9 == 0) {
    iVar10 = 0x19;
  }
  else {
    iVar10 = (this->_rowheights).arr[uVar2 - 1];
  }
  if (uVar2 != val) {
    piVar6 = (int *)realloc((this->_rowheights).arr,(ulong)(uint)val << 2);
    (this->_rowheights).arr = piVar6;
    (this->_rowheights)._size = val;
  }
  auVar5 = _DAT_00210030;
  auVar4 = _DAT_00210020;
  auVar3 = _DAT_00210010;
  if ((int)uVar2 < val) {
    piVar6 = (this->_rowheights).arr;
    lVar7 = (val - lVar9) + -1;
    auVar11._8_4_ = (int)lVar7;
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_00210030;
    do {
      auVar13._8_4_ = (int)uVar8;
      auVar13._0_8_ = uVar8;
      auVar13._12_4_ = (int)(uVar8 >> 0x20);
      auVar14 = (auVar13 | auVar4) ^ auVar5;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        piVar6[lVar9 + uVar8] = iVar10;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        piVar6[lVar9 + uVar8 + 1] = iVar10;
      }
      auVar13 = (auVar13 | auVar3) ^ auVar5;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        piVar6[lVar9 + uVar8 + 2] = iVar10;
        piVar6[lVar9 + uVar8 + 3] = iVar10;
      }
      uVar8 = uVar8 + 4;
    } while (((val - lVar9) + 3U & 0xfffffffffffffffc) != uVar8);
  }
  table_resized(this);
  if ((iVar1 <= val) && (this->botrow < iVar1)) {
    return;
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::rows(int val) {
  int oldrows = _rows;
  _rows = val;
  {
    int default_h = ( _rowheights.size() > 0 ) ? _rowheights.back() : 25;
    int now_size = _rowheights.size();
    _rowheights.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _rowheights[now_size++] = default_h;	// fill new
    }
  }
  table_resized();
  
  // OPTIMIZATION: redraw only if change is visible.
  if ( val >= oldrows && oldrows > botrow ) {
    // NO REDRAW
  } else {
    redraw();
  }
}